

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uv_timer_s *puVar5;
  pointer piVar6;
  void *this_00;
  reference piVar7;
  mapped_type *ppcVar8;
  char *pcVar9;
  ostream *poVar10;
  double dVar11;
  pointer local_ad0;
  uint local_ab4;
  string local_ab0 [4];
  uint milliseconds;
  undefined1 local_a90 [8];
  ostringstream cmCTestLog_msg_5;
  string local_918 [32];
  undefined1 local_8f8 [8];
  ostringstream cmCTestLog_msg_4;
  string local_780 [32];
  undefined1 local_760 [8];
  ostringstream cmCTestLog_msg_3;
  string local_5e8 [32];
  undefined1 local_5c8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_450 [32];
  undefined1 local_430 [8];
  ostringstream cmCTestLog_msg_1;
  int *test_1;
  iterator __end2;
  iterator __begin2;
  TestList *__range2;
  undefined1 local_290 [7];
  bool onlyRunSerialTestsLeft;
  string local_270 [32];
  string local_250;
  undefined1 local_230 [8];
  ostringstream cmCTestLog_msg;
  bool testLoadOk;
  size_t processors;
  int *test;
  iterator __end1;
  iterator __begin1;
  TestList *__range1;
  TestList copy;
  size_t spareLoad;
  unsigned_long systemLoad;
  SystemInformation local_50;
  SystemInformation info;
  string testWithMinProcessors;
  size_t minProcessorsRequired;
  pointer piStack_18;
  bool allTestsFailedTestLoadCheck;
  size_t numToStart;
  cmCTestMultiProcessHandler *this_local;
  
  puVar5 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get
                     ((uv_handle_ptr_base_<uv_timer_s> *)&this->TestLoadRetryTimer);
  if (puVar5 != (uv_timer_s *)0x0) {
    puVar5 = ::cm::uv_handle_ptr_::operator_cast_to_uv_timer_s_
                       ((uv_handle_ptr_ *)&this->TestLoadRetryTimer);
    uv_timer_stop(puVar5);
  }
  bVar2 = std::
          map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
          ::empty(&(this->Tests).
                   super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                 );
  if (bVar2) {
    ::cm::uv_handle_ptr_base_<uv_timer_s>::reset
              ((uv_handle_ptr_base_<uv_timer_s> *)&this->TestLoadRetryTimer);
  }
  else {
    bVar2 = CheckStopTimePassed(this);
    if ((!bVar2) &&
       ((bVar2 = CheckStopOnFailure(this), !bVar2 ||
        (bVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty(this->Failed), bVar2)))) {
      piStack_18 = (pointer)0x0;
      if (this->RunningCount < this->ParallelLevel) {
        piStack_18 = (pointer)(this->ParallelLevel - this->RunningCount);
      }
      if ((piStack_18 != (pointer)0x0) && ((this->SerialTestRunning & 1U) == 0)) {
        bVar2 = false;
        testWithMinProcessors.field_2._8_8_ = this->ParallelLevel;
        std::__cxx11::string::string((string *)&info);
        cmsys::SystemInformation::SystemInformation(&local_50);
        spareLoad = 0;
        copy.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (this->TestLoad != 0) {
          bVar2 = true;
          if (this->FakeLoadForTesting == 0) {
            dVar11 = cmsys::SystemInformation::GetLoadAverage(&local_50);
            dVar11 = ceil(dVar11);
            spareLoad = (long)dVar11 | (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f
            ;
          }
          else {
            spareLoad = this->FakeLoadForTesting;
            this->FakeLoadForTesting = 1;
          }
          if (spareLoad < this->TestLoad) {
            local_ad0 = (pointer)(this->TestLoad - spareLoad);
          }
          else {
            local_ad0 = (pointer)0x0;
          }
          copy.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_ad0;
          if (local_ad0 < piStack_18) {
            piStack_18 = local_ad0;
          }
        }
        TestList::TestList((TestList *)&__range1,&this->SortedTests);
        __end1 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&__range1);
        test = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)&__range1);
        while ((bVar3 = __gnu_cxx::operator!=
                                  (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                            *)&test), bVar3 &&
               (piVar7 = __gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&__end1), (this->SerialTestRunning & 1U) == 0))) {
          ppcVar8 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&(this->Properties).
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,piVar7);
          if ((((*ppcVar8)->RunSerial & 1U) == 0) || (this->RunningCount == 0)) {
            piVar6 = (pointer)GetProcessorsUsed(this,*piVar7);
            bVar3 = true;
            if ((this->TestLoad != 0) &&
               (bVar3 = piVar6 <= copy.super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage, bVar3)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
              poVar10 = std::operator<<((ostream *)local_230,"OK to run ");
              GetName_abi_cxx11_(&local_250,this,*piVar7);
              poVar10 = std::operator<<(poVar10,(string *)&local_250);
              poVar10 = std::operator<<(poVar10,", it requires ");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,(ulong)piVar6);
              poVar10 = std::operator<<(poVar10," procs & system load is: ");
              this_00 = (void *)std::ostream::operator<<(poVar10,spareLoad);
              std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&local_250);
              pcVar1 = this->CTest;
              std::__cxx11::ostringstream::str();
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                           ,0x232,pcVar9,false);
              std::__cxx11::string::~string(local_270);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
              bVar2 = false;
            }
            if (piVar6 <= (ulong)testWithMinProcessors.field_2._8_8_) {
              GetName_abi_cxx11_((string *)local_290,this,*piVar7);
              std::__cxx11::string::operator=((string *)&info,(string *)local_290);
              std::__cxx11::string::~string((string *)local_290);
              testWithMinProcessors.field_2._8_8_ = piVar6;
            }
            if (((bVar3) && (piVar6 <= piStack_18)) && (bVar3 = StartTest(this,*piVar7), bVar3)) {
              piStack_18 = (pointer)((long)piStack_18 - (long)piVar6);
            }
            else if (piStack_18 == (pointer)0x0) break;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end1);
        }
        if (bVar2) {
          bVar2 = true;
          __end2 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)&__range1);
          test_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)&__range1);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                             *)&test_1), bVar3) {
            piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end2);
            ppcVar8 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&(this->Properties).
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,piVar7);
            if (((*ppcVar8)->RunSerial & 1U) == 0) {
              bVar2 = false;
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end2);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_430);
          std::operator<<((ostream *)local_430,"***** WAITING, ");
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x24e,pcVar9,false);
          std::__cxx11::string::~string(local_450);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_430);
          if ((this->SerialTestRunning & 1U) == 0) {
            if (bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
              std::operator<<((ostream *)local_760,
                              "Only RUN_SERIAL tests remain, awaiting available slot.");
              pcVar1 = this->CTest;
              std::__cxx11::ostringstream::str();
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                           ,0x255,pcVar9,false);
              std::__cxx11::string::~string(local_780);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8f8);
              poVar10 = std::operator<<((ostream *)local_8f8,"System Load: ");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,spareLoad);
              poVar10 = std::operator<<(poVar10,", Max Allowed Load: ");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->TestLoad);
              poVar10 = std::operator<<(poVar10,", Smallest test ");
              poVar10 = std::operator<<(poVar10,(string *)&info);
              poVar10 = std::operator<<(poVar10," requires ");
              std::ostream::operator<<(poVar10,testWithMinProcessors.field_2._8_8_);
              pcVar1 = this->CTest;
              std::__cxx11::ostringstream::str();
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                           ,0x25c,pcVar9,false);
              std::__cxx11::string::~string(local_918);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8f8);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
            std::operator<<((ostream *)local_5c8,"Waiting for RUN_SERIAL test to finish.");
            pcVar1 = this->CTest;
            std::__cxx11::ostringstream::str();
            pcVar9 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x252,pcVar9,false);
            std::__cxx11::string::~string(local_5e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a90);
          poVar10 = std::operator<<((ostream *)local_a90,"*****");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x25f,pcVar9,false);
          std::__cxx11::string::~string(local_ab0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a90);
          uVar4 = cmSystemTools::RandomSeed();
          local_ab4 = (uVar4 % 5 + 1) * 1000;
          if (this->FakeLoadForTesting != 0) {
            local_ab4 = 10;
          }
          puVar5 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get
                             ((uv_handle_ptr_base_<uv_timer_s> *)&this->TestLoadRetryTimer);
          if (puVar5 == (uv_timer_s *)0x0) {
            ::cm::uv_timer_ptr::init(&this->TestLoadRetryTimer,(EVP_PKEY_CTX *)&this->Loop);
          }
          ::cm::uv_timer_ptr::start(&this->TestLoadRetryTimer,OnTestLoadRetryCB,(ulong)local_ab4,0);
        }
        TestList::~TestList((TestList *)&__range1);
        cmsys::SystemInformation::~SystemInformation(&local_50);
        std::__cxx11::string::~string((string *)&info);
      }
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  if (this->TestLoadRetryTimer.get() != nullptr) {
    // This timer may be waiting to call StartNextTests again.
    // Since we have been called it is no longer needed.
    uv_timer_stop(this->TestLoadRetryTimer);
  }

  if (this->Tests.empty()) {
    this->TestLoadRetryTimer.reset();
    return;
  }

  if (this->CheckStopTimePassed()) {
    return;
  }

  if (this->CheckStopOnFailure() && !this->Failed->empty()) {
    return;
  }

  size_t numToStart = 0;

  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    if (this->FakeLoadForTesting > 0) {
      systemLoad = this->FakeLoadForTesting;
      // Drop the fake load for the next iteration to a value low enough
      // that the next iteration will start tests.
      this->FakeLoadForTesting = 1;
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (auto const& test : copy) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also
    // running.
    if (this->Properties[test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = this->GetProcessorsUsed(test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG,
                   "OK to run " << this->GetName(test) << ", it requires "
                                << processors << " procs & system load is: "
                                << systemLoad << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = this->GetName(test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(test)) {
      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    // Find out whether there are any non RUN_SERIAL tests left, so that the
    // correct warning may be displayed.
    bool onlyRunSerialTestsLeft = true;
    for (auto const& test : copy) {
      if (!this->Properties[test]->RunSerial) {
        onlyRunSerialTestsLeft = false;
      }
    }
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "***** WAITING, ");

    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else if (onlyRunSerialTestsLeft) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Only RUN_SERIAL tests remain, awaiting available slot.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "*****" << std::endl);

    // Wait between 1 and 5 seconds before trying again.
    unsigned int milliseconds = (cmSystemTools::RandomSeed() % 5 + 1) * 1000;
    if (this->FakeLoadForTesting) {
      milliseconds = 10;
    }
    if (this->TestLoadRetryTimer.get() == nullptr) {
      this->TestLoadRetryTimer.init(this->Loop, this);
    }
    this->TestLoadRetryTimer.start(
      &cmCTestMultiProcessHandler::OnTestLoadRetryCB, milliseconds, 0);
  }
}